

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFHighLevelEncoder.cpp
# Opt level: O3

void ZXing::Pdf417::EncodeBinary
               (string *bytes,int startpos,int count,int startmode,
               vector<int,_std::allocator<int>_> *output)

{
  iterator iVar1;
  uint uVar2;
  undefined4 in_register_0000000c;
  vector<int,std::allocator<int>> *this;
  ulong uVar3;
  int *__args;
  long lVar4;
  ulong uVar5;
  int chars [5];
  uint local_48 [6];
  
  this = (vector<int,std::allocator<int>> *)CONCAT44(in_register_0000000c,startmode);
  if (startpos == 1 && count == 0) {
    iVar1._M_current = *(int **)(this + 8);
    if (iVar1._M_current == *(int **)(this + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(this,iVar1,&SHIFT_TO_BYTE)
      ;
    }
    else {
      *iVar1._M_current = 0x391;
      *(int **)(this + 8) = iVar1._M_current + 1;
    }
    uVar5 = 0;
    goto LAB_0017cf83;
  }
  uVar2 = startpos * -0x55555555 + 0x2aaaaaaa;
  iVar1._M_current = *(int **)(this + 8);
  if ((uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f) < 0x2aaaaaab) {
    if (iVar1._M_current == *(int **)(this + 0x10)) {
      __args = &LATCH_TO_BYTE;
      goto LAB_0017cecc;
    }
    *iVar1._M_current = 0x39c;
LAB_0017ceb2:
    *(int **)(this + 8) = iVar1._M_current + 1;
  }
  else {
    if (iVar1._M_current != *(int **)(this + 0x10)) {
      *iVar1._M_current = 0x385;
      goto LAB_0017ceb2;
    }
    __args = &LATCH_TO_BYTE_PADDED;
LAB_0017cecc:
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(this,iVar1,__args);
  }
  uVar5 = 0;
  if (5 < startpos) {
    uVar5 = 0;
    do {
      lVar4 = -6;
      uVar3 = 0;
      do {
        uVar3 = (ulong)(byte)(bytes->_M_dataplus)._M_p[lVar4 + uVar5 + 6] | uVar3 << 8;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0);
      lVar4 = 0;
      do {
        local_48[lVar4] = (int)uVar3 + (int)((long)uVar3 / 900) * -900;
        lVar4 = lVar4 + 1;
        uVar3 = (long)uVar3 / 900;
      } while (lVar4 != 5);
      lVar4 = 0x10;
      do {
        iVar1._M_current = *(int **)(this + 8);
        if (iVar1._M_current == *(int **)(this + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this,iVar1,(int *)((long)local_48 + lVar4));
        }
        else {
          *iVar1._M_current = *(int *)((long)local_48 + lVar4);
          *(int **)(this + 8) = iVar1._M_current + 1;
        }
        lVar4 = lVar4 + -4;
      } while (lVar4 != -4);
      uVar5 = uVar5 + 6;
    } while (5 < startpos - (int)uVar5);
  }
LAB_0017cf83:
  if ((int)uVar5 < startpos) {
    uVar5 = uVar5 & 0xffffffff;
    do {
      local_48[0] = (uint)(byte)(bytes->_M_dataplus)._M_p[uVar5];
      iVar1._M_current = *(int **)(this + 8);
      if (iVar1._M_current == *(int **)(this + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this,iVar1,(int *)local_48);
      }
      else {
        *iVar1._M_current = local_48[0];
        *(int **)(this + 8) = iVar1._M_current + 1;
      }
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 < startpos);
  }
  return;
}

Assistant:

static void EncodeBinary(const std::string& bytes, int startpos, int count, int startmode, std::vector<int>& output)
{
	if (count == 1 && startmode == TEXT_COMPACTION) {
		output.push_back(SHIFT_TO_BYTE);
	}
	else {
		if ((count % 6) == 0) {
			output.push_back(LATCH_TO_BYTE);
		}
		else {
			output.push_back(LATCH_TO_BYTE_PADDED);
		}
	}

	int idx = startpos;
	// Encode sixpacks
	if (count >= 6) {
		int chars[5];
		while ((startpos + count - idx) >= 6) {
			long t = 0;
			for (int i = 0; i < 6; i++) {
				t <<= 8;
				t += bytes[idx + i] & 0xff;
			}
			for (int i = 0; i < 5; i++) {
				chars[i] = t % 900;
				t /= 900;
			}
			for (int i = 4; i >= 0; i--) {
				output.push_back(chars[i]);
			}
			idx += 6;
		}
	}
	//Encode rest (remaining n<5 bytes if any)
	for (int i = idx; i < startpos + count; i++) {
		int ch = bytes[i] & 0xff;
		output.push_back(ch);
	}
}